

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseCatchInstrList(WastParser *this,CatchVector *catches)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  TokenType TVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_182;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  iterator local_160;
  size_type local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  Enum local_134;
  size_t local_130;
  size_t local_128;
  char *local_120;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_118;
  int local_110;
  Enum local_10c;
  undefined1 local_108 [8];
  Token token;
  undefined1 local_a8 [8];
  Catch catch_;
  bool parsedCatchAll;
  bool parsedCatch;
  CatchVector *catches_local;
  WastParser *this_local;
  
  catch_.exprs.size_._7_1_ = 0;
  catch_.exprs.size_._6_1_ = 0;
  do {
    TVar2 = Peek(this,0);
    bVar1 = anon_unknown_1::IsCatch(TVar2);
    if (!bVar1) {
      if ((catch_.exprs.size_._7_1_ & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"catch",&local_181);
        local_160 = &local_180;
        local_158 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_182);
        __l._M_len = local_158;
        __l._M_array = local_160;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_150,__l,&local_182);
        this_local._4_4_ = ErrorExpected(this,&local_150,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_182);
        local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160;
        do {
          local_198 = local_198 + -1;
          std::__cxx11::string::~string((string *)local_198);
        } while (local_198 != &local_180);
        std::allocator<char>::~allocator(&local_181);
        return (Result)this_local._4_4_;
      }
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    GetLocation((Location *)&token.field_2.literal_.text._M_str,this);
    Catch::Catch((Catch *)local_a8,(Location *)&token.field_2.literal_.text._M_str);
    Consume((Token *)local_108,this);
    TVar2 = Token::token_type((Token *)local_108);
    if (TVar2 == Catch) {
      local_10c = (Enum)ParseVar(this,(Var *)((long)&catch_.loc.field_1 + 8));
      bVar1 = Failed((Result)local_10c);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_110 = 1;
      }
      else {
LAB_00191284:
        local_134 = (Enum)ParseInstrList(this,(ExprList *)((long)&catch_.var.field_2 + 0x18));
        bVar1 = Failed((Result)local_134);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_110 = 1;
        }
        else {
          std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::push_back
                    (catches,(value_type *)local_a8);
          catch_.exprs.size_._7_1_ = 1;
          local_110 = 0;
        }
      }
    }
    else {
      if ((catch_.exprs.size_._6_1_ & 1) == 0) {
        catch_.exprs.size_._6_1_ = 1;
        goto LAB_00191284;
      }
      local_130 = (size_t)local_108;
      local_128 = token.loc.filename._M_len;
      local_120 = token.loc.filename._M_str;
      local_118.offset = (size_t)token.loc.field_1.field_1.offset;
      Error(this,0x22188a);
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_110 = 1;
    }
    Catch::~Catch((Catch *)local_a8);
    if (local_110 != 0) {
      return (Result)this_local._4_4_;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseCatchInstrList(CatchVector* catches) {
  WABT_TRACE(ParseCatchInstrList);
  bool parsedCatch = false;
  bool parsedCatchAll = false;

  while (IsCatch(Peek())) {
    Catch catch_(GetLocation());

    auto token = Consume();
    if (token.token_type() == TokenType::Catch) {
      CHECK_RESULT(ParseVar(&catch_.var));
    } else {
      if (parsedCatchAll) {
        Error(token.loc, "multiple catch_all clauses not allowed");
        return Result::Error;
      }
      parsedCatchAll = true;
    }

    CHECK_RESULT(ParseInstrList(&catch_.exprs));
    catches->push_back(std::move(catch_));
    parsedCatch = true;
  }

  if (!parsedCatch) {
    return ErrorExpected({"catch"});
  }

  return Result::Ok;
}